

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_hdwallet.cpp
# Opt level: O2

ConvertEntropyToMnemonicResponseStruct *
cfd::js::api::HDWalletStructApi::ConvertEntropyToMnemonic
          (ConvertEntropyToMnemonicResponseStruct *__return_storage_ptr__,
          ConvertEntropyToMnemonicRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::ConvertEntropyToMnemonicResponseStruct_(const_cfd::js::api::ConvertEntropyToMnemonicRequestStruct_&)>
  local_f0;
  ConvertEntropyToMnemonicResponseStruct local_d0;
  
  ConvertEntropyToMnemonicResponseStruct::ConvertEntropyToMnemonicResponseStruct
            (__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::ConvertEntropyToMnemonicResponseStruct_(const_cfd::js::api::ConvertEntropyToMnemonicRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_hdwallet.cpp:100:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::ConvertEntropyToMnemonicResponseStruct_(const_cfd::js::api::ConvertEntropyToMnemonicRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_hdwallet.cpp:100:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f0,"ConvertEntropyToMnemonic",&local_119);
  ExecuteStructApi<cfd::js::api::ConvertEntropyToMnemonicRequestStruct,cfd::js::api::ConvertEntropyToMnemonicResponseStruct>
            (&local_d0,(api *)request,(ConvertEntropyToMnemonicRequestStruct *)&local_118,&local_f0,
             in_R8);
  ConvertEntropyToMnemonicResponseStruct::operator=(__return_storage_ptr__,&local_d0);
  ConvertEntropyToMnemonicResponseStruct::~ConvertEntropyToMnemonicResponseStruct(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

ConvertEntropyToMnemonicResponseStruct
HDWalletStructApi::ConvertEntropyToMnemonic(
    const ConvertEntropyToMnemonicRequestStruct& request) {
  auto call_func = [](const ConvertEntropyToMnemonicRequestStruct& request)
      -> ConvertEntropyToMnemonicResponseStruct {
    ConvertEntropyToMnemonicResponseStruct response;
    ByteData entropy(request.entropy);
    std::string language = request.language;

    // entropy to mnemonic
    HDWalletApi api;
    std::vector<std::string> mnemonic =
        api.ConvertEntropyToMnemonic(entropy, language);

    response.mnemonic = mnemonic;
    return response;
  };

  ConvertEntropyToMnemonicResponseStruct result;
  result = ExecuteStructApi<
      ConvertEntropyToMnemonicRequestStruct,
      ConvertEntropyToMnemonicResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}